

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::SmallButton(char *label)

{
  bool bVar1;
  bool pressed;
  float backup_padding_y;
  ImGuiContext *g;
  ImGuiButtonFlags in_stack_0000006c;
  ImVec2 *in_stack_00000070;
  char *in_stack_00000078;
  ImVec2 local_20;
  float local_14;
  ImGuiContext *local_10;
  
  local_10 = GImGui;
  local_14 = (GImGui->Style).FramePadding.y;
  (GImGui->Style).FramePadding.y = 0.0;
  ImVec2::ImVec2(&local_20,0.0,0.0);
  bVar1 = ButtonEx(in_stack_00000078,in_stack_00000070,in_stack_0000006c);
  (local_10->Style).FramePadding.y = local_14;
  return bVar1;
}

Assistant:

bool ImGui::SmallButton(const char* label)
{
    ImGuiContext& g = *GImGui;
    float backup_padding_y = g.Style.FramePadding.y;
    g.Style.FramePadding.y = 0.0f;
    bool pressed = ButtonEx(label, ImVec2(0, 0), ImGuiButtonFlags_AlignTextBaseLine);
    g.Style.FramePadding.y = backup_padding_y;
    return pressed;
}